

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QShaderDescription::UniformBlock>::resize_internal
          (QList<QShaderDescription::UniformBlock> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QShaderDescription::UniformBlock> *this_00;
  __off_t __length;
  QArrayDataPointer<QShaderDescription::UniformBlock> *in_RSI;
  QArrayDataPointer<QShaderDescription::UniformBlock> *in_RDI;
  QArrayDataPointer<QShaderDescription::UniformBlock> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QShaderDescription::UniformBlock> *this_01;
  QArrayDataPointer<QShaderDescription::UniformBlock> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QShaderDescription::UniformBlock> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QShaderDescription::UniformBlock> *__file;
  
  QArrayDataPointer<QShaderDescription::UniformBlock>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QShaderDescription::UniformBlock>::needsDetach
                    (in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QShaderDescription::UniformBlock> *)
         capacity((QList<QShaderDescription::UniformBlock> *)0x6ef541);
    qVar2 = QArrayDataPointer<QShaderDescription::UniformBlock>::freeSpaceAtBegin
                      (in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QShaderDescription::UniformBlock> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QGenericArrayOps<QShaderDescription::UniformBlock> *)
                QArrayDataPointer<QShaderDescription::UniformBlock>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QShaderDescription::UniformBlock>::truncate
                (this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QShaderDescription::UniformBlock>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (UniformBlock **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}